

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O3

DecodeRawTransactionTxInStruct * __thiscall
cfd::js::api::json::DecodeRawTransactionTxIn::ConvertToStruct
          (DecodeRawTransactionTxInStruct *__return_storage_ptr__,DecodeRawTransactionTxIn *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  undefined1 local_98 [32];
  _Alloc_hider local_78;
  char local_68 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  
  (__return_storage_ptr__->coinbase)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->coinbase).field_2;
  (__return_storage_ptr__->coinbase)._M_string_length = 0;
  (__return_storage_ptr__->coinbase).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->txid)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->txid).field_2
  ;
  (__return_storage_ptr__->txid)._M_string_length = 0;
  (__return_storage_ptr__->txid).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->vout = 0;
  (__return_storage_ptr__->script_sig).asm_._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->script_sig).asm_.field_2;
  (__return_storage_ptr__->script_sig).asm_._M_string_length = 0;
  (__return_storage_ptr__->script_sig).asm_.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->script_sig).hex._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->script_sig).hex.field_2;
  (__return_storage_ptr__->script_sig).hex._M_string_length = 0;
  (__return_storage_ptr__->script_sig).hex.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(__return_storage_ptr__->script_sig).ignore_items._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->script_sig).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  (__return_storage_ptr__->script_sig).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->script_sig).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = &p_Var1->_M_header;
  (__return_storage_ptr__->script_sig).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = &p_Var1->_M_header;
  p_Var2 = &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  __return_storage_ptr__->sequence = 0;
  (__return_storage_ptr__->txinwitness).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->txinwitness).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->script_sig).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count
       = 0;
  (__return_storage_ptr__->txinwitness).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->txid);
  __return_storage_ptr__->vout = this->vout_;
  DecodeUnlockingScript::ConvertToStruct((DecodeUnlockingScriptStruct *)local_98,&this->script_sig_)
  ;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->script_sig,(string *)local_98);
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->script_sig).hex,(string *)&local_78);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->script_sig).ignore_items._M_t);
  if (local_58._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var2 = &local_58._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->script_sig).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_color = local_58._M_impl.super__Rb_tree_header._M_header._M_color;
    (__return_storage_ptr__->script_sig).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = local_58._M_impl.super__Rb_tree_header._M_header._M_parent;
    (__return_storage_ptr__->script_sig).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_left = local_58._M_impl.super__Rb_tree_header._M_header._M_left;
    (__return_storage_ptr__->script_sig).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_right = local_58._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_58._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var1->_M_header;
    (__return_storage_ptr__->script_sig).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_node_count = local_58._M_impl.super__Rb_tree_header._M_node_count;
    local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_58._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_58._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_58);
  if (local_78._M_p != local_68) {
    operator_delete(local_78._M_p);
  }
  if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
    operator_delete((void *)local_98._0_8_);
  }
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ConvertToStruct(&local_b8,&this->txinwitness_);
  local_98._16_8_ =
       (__return_storage_ptr__->txinwitness).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->txinwitness).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_b8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_98._0_8_ =
       (__return_storage_ptr__->txinwitness).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_98._8_8_ =
       (__return_storage_ptr__->txinwitness).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->txinwitness).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_b8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->txinwitness).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_b8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  __return_storage_ptr__->sequence = this->sequence_;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

DecodeRawTransactionTxInStruct DecodeRawTransactionTxIn::ConvertToStruct() const {  // NOLINT
  DecodeRawTransactionTxInStruct result;
  result.coinbase = coinbase_;
  result.txid = txid_;
  result.vout = vout_;
  result.script_sig = script_sig_.ConvertToStruct();
  result.txinwitness = txinwitness_.ConvertToStruct();
  result.sequence = sequence_;
  result.ignore_items = ignore_items;
  return result;
}